

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

tuple<bool,_float,_cv::Mat> *
removeBlurIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  float fVar1;
  _OutputArray local_2e8;
  _InputArray local_2d0;
  _InputArray local_2b8;
  Mat edges;
  Mat smoothened;
  Mat local_1e0 [96];
  Mat sharpened;
  
  cv::Mat::Mat(local_1e0,inputImg);
  fVar1 = calculateEdginess(local_1e0);
  cv::Mat::~Mat(local_1e0);
  if (fVar1 <= 68.0) {
    cv::Mat::Mat((Mat *)__return_storage_ptr__,inputImg);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl = fVar1;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = 0;
  }
  else {
    cv::Mat::Mat(&smoothened);
    _sharpened = 0x1010000;
    _edges = 0x2010000;
    cv::GaussianBlur(0x4014000000000000,0x4014000000000000);
    cv::operator-(&sharpened,inputImg);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&edges);
    cv::MatExpr::~MatExpr((MatExpr *)&sharpened);
    cv::Mat::Mat(&sharpened);
    local_2b8.sz.width = 0;
    local_2b8.sz.height = 0;
    local_2b8.flags = 0x1010000;
    local_2d0.sz.width = 0;
    local_2d0.sz.height = 0;
    local_2e8.super__InputArray.sz.width = 0;
    local_2e8.super__InputArray.sz.height = 0;
    local_2d0.flags = 0x1010000;
    local_2e8.super__InputArray.flags = 0x2010000;
    local_2e8.super__InputArray.obj = (MatExpr *)&sharpened;
    local_2d0.obj = (MatExpr *)&edges;
    local_2b8.obj = inputImg;
    cv::addWeighted(&local_2b8,1.0,&local_2d0,0.7,0.0,&local_2e8,-1);
    cv::Mat::Mat((Mat *)__return_storage_ptr__,&sharpened);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl = fVar1;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = 1;
    cv::Mat::~Mat(&sharpened);
    cv::Mat::~Mat(&edges);
    cv::Mat::~Mat(&smoothened);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeBlurIfPresent(Mat const& inputImg) {
    float blurPercentage = calculateEdginess(inputImg);
    if (blurPercentage > 68) {
        Mat smoothened;
        GaussianBlur(inputImg, smoothened,Size(23, 23), 5,5);
        Mat edges = inputImg - smoothened;
        Mat sharpened;
        addWeighted(inputImg, 1, edges, 0.7, 0,sharpened);
        return make_tuple(true, blurPercentage, sharpened);
    } else {
        return make_tuple(false, blurPercentage, inputImg);
    }
}